

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O0

void __thiscall Face::print_triangle(Face *this,Corner ref_corner,int layer,int entry)

{
  Color CVar1;
  Color triangle_color;
  int entry_local;
  int layer_local;
  Corner ref_corner_local;
  Face *this_local;
  
  CVar1 = get_triangle_color(this,ref_corner,layer,entry);
  switch(CVar1) {
  case green:
    printf("\x1b[1;32mG\x1b[0m");
    break;
  case blue:
    printf("\x1b[1;34mB\x1b[0m");
    break;
  case yellow:
    printf("\x1b[1;33mY\x1b[0m");
    break;
  case red:
    printf("\x1b[1;31mR\x1b[0m");
  }
  return;
}

Assistant:

void Face::print_triangle(Corner ref_corner, int layer, int entry){
    Color triangle_color = get_triangle_color(ref_corner, layer, entry);
    switch (triangle_color)
    {
    case Color::blue:
        printf("\033[1;34mB\033[0m");
        break;
    case Color::red:
        printf("\033[1;31mR\033[0m");
        break;             
    case Color::yellow:
        printf("\033[1;33mY\033[0m");
        break;
    case Color::green:
        printf("\033[1;32mG\033[0m");
        break;
    default:
        break;
    }
}